

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int add_line(backtrace_state *state,dwarf_data *ddata,uintptr_t pc,char *filename,int lineno,
            backtrace_error_callback error_callback,void *data,line_vector *vec)

{
  void *pvVar1;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  
  if (vec->count != 0) {
    pvVar1 = (vec->vec).base;
    lVar4 = vec->count * 0x18;
    if (((*(uintptr_t *)((long)pvVar1 + lVar4 + -0x18) == pc) &&
        (plVar3 = (long *)((long)pvVar1 + lVar4), (char *)plVar3[-2] == filename)) &&
       ((int)plVar3[-1] == lineno)) goto LAB_0012b1d3;
  }
  plVar3 = (long *)tcmalloc_backtrace_vector_grow(state,0x18,error_callback,data,&vec->vec);
  if (plVar3 != (long *)0x0) {
    *plVar3 = pc + (ddata->base_address).m;
    plVar3[1] = (long)filename;
    *(int *)(plVar3 + 2) = lineno;
    sVar2 = vec->count;
    *(int *)((long)plVar3 + 0x14) = (int)sVar2;
    vec->count = sVar2 + 1;
  }
LAB_0012b1d3:
  return (int)plVar3;
}

Assistant:

static int
add_line (struct backtrace_state *state, struct dwarf_data *ddata,
	  uintptr_t pc, const char *filename, int lineno,
	  backtrace_error_callback error_callback, void *data,
	  struct line_vector *vec)
{
  struct line *ln;

  /* If we are adding the same mapping, ignore it.  This can happen
     when using discriminators.  */
  if (vec->count > 0)
    {
      ln = (struct line *) vec->vec.base + (vec->count - 1);
      if (pc == ln->pc && filename == ln->filename && lineno == ln->lineno)
	return 1;
    }

  ln = ((struct line *)
	backtrace_vector_grow (state, sizeof (struct line), error_callback,
			       data, &vec->vec));
  if (ln == NULL)
    return 0;

  /* Add in the base address here, so that we can look up the PC
     directly.  */
  ln->pc = libbacktrace_add_base (pc, ddata->base_address);

  ln->filename = filename;
  ln->lineno = lineno;
  ln->idx = vec->count;

  ++vec->count;

  return 1;
}